

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  pointer ppTVar1;
  void *pvVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  pointer ppTVar6;
  char *pcVar7;
  undefined4 in_register_00000014;
  uint uVar8;
  char *pcVar9;
  String SVar10;
  void *local_50 [2];
  void *local_40 [2];
  
  uVar8 = 0;
  ColoredPrintf(COLOR_GREEN,"[==========] ",CONCAT44(in_register_00000014,param_2));
  uVar5 = UnitTestImpl::test_to_run_count(unit_test->impl_);
  pcVar9 = "tests";
  pcVar7 = "tests";
  if (uVar5 == 1) {
    pcVar7 = "test";
  }
  String::Format((char *)local_50,"%d %s",(ulong)uVar5,pcVar7);
  pvVar2 = local_50[0];
  ppTVar6 = (unit_test->impl_->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppTVar1 = (unit_test->impl_->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppTVar6 == ppTVar1) {
    pcVar7 = "test cases";
  }
  else {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + (*ppTVar6)->should_run_;
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 != ppTVar1);
    pcVar7 = "test cases";
    if (uVar8 == 1) {
      pcVar7 = "test case";
    }
  }
  String::Format((char *)local_40,"%d %s",(ulong)uVar8,pcVar7);
  pvVar3 = local_40[0];
  printf("%s from %s ran.",pvVar2,local_40[0]);
  if (pvVar3 != (void *)0x0) {
    operator_delete__(pvVar3);
  }
  if (pvVar2 != (void *)0x0) {
    operator_delete__(pvVar2);
  }
  if (FLAGS_gtest_print_time == '\x01') {
    local_40[0] = (void *)unit_test->impl_->elapsed_time_;
    SVar10 = StreamableToString<long_long>((internal *)local_50,(longlong *)local_40);
    printf(" (%s ms total)",local_50[0],SVar10.length_);
    if (local_50[0] != (void *)0x0) {
      operator_delete__(local_50[0]);
    }
  }
  putchar(10);
  ColoredPrintf(COLOR_GREEN,"[  PASSED  ] ");
  uVar5 = UnitTestImpl::successful_test_count(unit_test->impl_);
  pcVar7 = "tests";
  if (uVar5 == 1) {
    pcVar7 = "test";
  }
  SVar10 = String::Format((char *)local_50,"%d %s",(ulong)uVar5,pcVar7);
  pvVar2 = local_50[0];
  printf("%s.\n",local_50[0],SVar10.length_);
  if (pvVar2 != (void *)0x0) {
    operator_delete__(pvVar2);
  }
  uVar5 = UnitTestImpl::failed_test_count(unit_test->impl_);
  bVar4 = UnitTestImpl::Passed(unit_test->impl_);
  if (!bVar4) {
    uVar8 = UnitTestImpl::failed_test_count(unit_test->impl_);
    ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
    if (uVar8 == 1) {
      pcVar9 = "test";
    }
    SVar10 = String::Format((char *)local_50,"%d %s",(ulong)uVar8,pcVar9);
    printf("%s, listed below:\n",local_50[0],SVar10.length_);
    if (local_50[0] != (void *)0x0) {
      operator_delete__(local_50[0]);
    }
    PrintFailedTests(unit_test);
    pcVar7 = "TESTS";
    if (uVar5 == 1) {
      pcVar7 = "TEST";
    }
    printf("\n%2d FAILED %s\n",(ulong)uVar5,pcVar7);
  }
  uVar8 = UnitTestImpl::disabled_test_count(unit_test->impl_);
  if ((uVar8 != 0) && (FLAGS_gtest_also_run_disabled_tests == '\0')) {
    if (uVar5 == 0) {
      putchar(10);
    }
    pcVar7 = "TESTS";
    if (uVar8 == 1) {
      pcVar7 = "TEST";
    }
    ColoredPrintf(COLOR_YELLOW,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar8,pcVar7);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestCaseCount(unit_test.test_case_to_run_count()).c_str());
  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,  "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  int num_failures = unit_test.failed_test_count();
  if (!unit_test.Passed()) {
    const int failed_test_count = unit_test.failed_test_count();
    ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
    printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());
    PrintFailedTests(unit_test);
    printf("\n%2d FAILED %s\n", num_failures,
                        num_failures == 1 ? "TEST" : "TESTS");
  }

  int num_disabled = unit_test.disabled_test_count();
  if (num_disabled && !GTEST_FLAG(also_run_disabled_tests)) {
    if (!num_failures) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(COLOR_YELLOW,
                  "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled,
                  num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}